

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O1

void __thiscall
S2Builder::Graph::EdgeProcessor::EdgeProcessor
          (EdgeProcessor *this,GraphOptions *options,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_ids,IdSetLexicon *id_set_lexicon)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  long lVar3;
  undefined3 uVar4;
  DegenerateEdges DVar5;
  DuplicateEdges DVar6;
  SiblingPairs SVar7;
  int iVar8;
  ulong uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  allocator_type local_3a;
  allocator_type local_39;
  vector<int,_std::allocator<int>_> *local_38;
  
  uVar4 = *(undefined3 *)&options->field_0x11;
  (this->options_).allow_vertex_filtering_ = options->allow_vertex_filtering_;
  *(undefined3 *)&(this->options_).field_0x11 = uVar4;
  DVar5 = options->degenerate_edges_;
  DVar6 = options->duplicate_edges_;
  SVar7 = options->sibling_pairs_;
  (this->options_).edge_type_ = options->edge_type_;
  (this->options_).degenerate_edges_ = DVar5;
  (this->options_).duplicate_edges_ = DVar6;
  (this->options_).sibling_pairs_ = SVar7;
  this->edges_ = edges;
  this->input_ids_ = input_ids;
  this->id_set_lexicon_ = id_set_lexicon;
  local_38 = &this->out_edges_;
  std::vector<int,_std::allocator<int>_>::vector
            (local_38,(long)(edges->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(edges->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3,&local_39);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->in_edges_,
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_3a);
  (this->tmp_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tmp_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->new_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_edges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tmp_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _Var1._M_current =
       (this->out_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var2._M_current =
       (this->out_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var1._M_current != _Var2._M_current) {
    iVar8 = 0;
    _Var10._M_current = _Var1._M_current;
    do {
      *_Var10._M_current = iVar8;
      iVar8 = iVar8 + 1;
      _Var10._M_current = _Var10._M_current + 1;
    } while (_Var10._M_current != _Var2._M_current);
    if (_Var1._M_current != _Var2._M_current) {
      uVar9 = (long)_Var2._M_current - (long)_Var1._M_current >> 2;
      lVar3 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
                (_Var1,_Var2,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                  )this);
      if ((long)_Var2._M_current - (long)_Var1._M_current < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
                  (_Var1,_Var2,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                    )this);
      }
      else {
        _Var10._M_current = _Var1._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
                  (_Var1,_Var10,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                    )this);
        for (; _Var10._M_current != _Var2._M_current; _Var10._M_current = _Var10._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__0>>
                    (_Var10,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:891:51)>
                             )this);
        }
      }
    }
  }
  _Var1._M_current =
       (this->in_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var2._M_current =
       (this->in_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var1._M_current != _Var2._M_current) {
    iVar8 = 0;
    _Var10._M_current = _Var1._M_current;
    do {
      *_Var10._M_current = iVar8;
      iVar8 = iVar8 + 1;
      _Var10._M_current = _Var10._M_current + 1;
    } while (_Var10._M_current != _Var2._M_current);
    if (_Var1._M_current != _Var2._M_current) {
      uVar9 = (long)_Var2._M_current - (long)_Var1._M_current >> 2;
      lVar3 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
                (_Var1,_Var2,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                  )this);
      if ((long)_Var2._M_current - (long)_Var1._M_current < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
                  (_Var1,_Var2,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                    )this);
      }
      else {
        _Var10._M_current = _Var1._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
                  (_Var1,_Var10,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                    )this);
        for (; _Var10._M_current != _Var2._M_current; _Var10._M_current = _Var10._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::Graph::EdgeProcessor::EdgeProcessor(S2Builder::GraphOptions_const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,IdSetLexicon*)::__1>>
                    (_Var10,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:895:49)>
                             )this);
        }
      }
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (&this->new_edges_,
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->new_input_ids_,
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->edges_->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

Graph::EdgeProcessor::EdgeProcessor(const GraphOptions& options,
                                    vector<Edge>* edges,
                                    vector<InputEdgeIdSetId>* input_ids,
                                    IdSetLexicon* id_set_lexicon)
    : options_(options), edges_(*edges),
      input_ids_(*input_ids), id_set_lexicon_(id_set_lexicon),
      out_edges_(edges_.size()), in_edges_(edges_.size()) {
  // Sort the outgoing and incoming edges in lexigraphic order.  We use a
  // stable sort to ensure that each undirected edge becomes a sibling pair,
  // even if there are multiple identical input edges.
  std::iota(out_edges_.begin(), out_edges_.end(), 0);
  std::sort(out_edges_.begin(), out_edges_.end(), [this](EdgeId a, EdgeId b) {
      return StableLessThan(edges_[a], edges_[b], a, b);
    });
  std::iota(in_edges_.begin(), in_edges_.end(), 0);
  std::sort(in_edges_.begin(), in_edges_.end(), [this](EdgeId a, EdgeId b) {
      return StableLessThan(reverse(edges_[a]), reverse(edges_[b]), a, b);
    });
  new_edges_.reserve(edges_.size());
  new_input_ids_.reserve(edges_.size());
}